

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# L.c
# Opt level: O0

void envy_bios_print_bit_L(envy_bios *bios,FILE *out,uint mask)

{
  char *local_40;
  char *name;
  int local_30;
  int i;
  int ret;
  uint16_t addr;
  envy_bios_L *l;
  FILE *pFStack_18;
  uint mask_local;
  FILE *out_local;
  envy_bios *bios_local;
  
  _ret = &bios->L;
  local_30 = 0;
  name._4_4_ = 0;
  if ((_ret->bit != (envy_bios_bit_entry *)0x0) && ((mask & 0x4000) != 0)) {
    l._4_4_ = mask;
    pFStack_18 = (FILE *)out;
    out_local = (FILE *)bios;
    fprintf((FILE *)out,"BIT table \'L\' at 0x%x, version %i\n",(ulong)_ret->bit->offset,
            (ulong)_ret->bit->version);
    for (name._4_4_ = 0; (int)(name._4_4_ * 2) < (int)(uint)_ret->bit->t_len;
        name._4_4_ = name._4_4_ + 1) {
      local_30 = bios_u16((envy_bios *)out_local,(uint)_ret->bit->t_offset + name._4_4_ * 2,
                          (uint16_t *)((long)&i + 2));
      if ((local_30 == 0) && (i._2_2_ != 0)) {
        local_30 = parse_at((envy_bios *)out_local,name._4_4_,&local_40);
        fprintf(pFStack_18,"0x%02x: 0x%x => L %s\n",(ulong)(name._4_4_ << 1),(ulong)i._2_2_,local_40
               );
      }
    }
    fprintf(pFStack_18,"\n");
  }
  return;
}

Assistant:

void
envy_bios_print_bit_L(struct envy_bios *bios, FILE *out, unsigned mask)
{
	struct envy_bios_L *l = &bios->L;
	uint16_t addr;
	int ret = 0, i = 0;

	if (!l->bit || !(mask & ENVY_BIOS_PRINT_L))
		return;

	fprintf(out, "BIT table 'L' at 0x%x, version %i\n",
		l->bit->offset, l->bit->version);

	for (i = 0; i * 2 < l->bit->t_len; ++i) {
		ret = bios_u16(bios, l->bit->t_offset + (i * 2), &addr);
		if (!ret && addr) {
			const char *name;
			ret = parse_at(bios, i, &name);
			fprintf(out, "0x%02x: 0x%x => L %s\n", i * 2, addr, name);
		}
	}

	fprintf(out, "\n");
}